

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

void Ivy_ManTestCutsAll(Ivy_Man_t *p)

{
  Ivy_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  uint uVar4;
  int level;
  uint uVar5;
  long lVar6;
  uint uVar7;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar4 = -(p->nObjs[5] + p->nObjs[6]);
  pVVar2 = p->vObjs;
  if (pVVar2->nSize < 1) {
    uVar7 = 0;
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    uVar7 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar2->pArray[lVar6];
      if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
        Ivy_NodeFindCutsAll(p,pObj,5);
        uVar4 = uVar4 + Ivy_NodeFindCutsAll::CutStore.nCuts;
        uVar5 = uVar5 + (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100);
        uVar7 = uVar7 + 1;
      }
      lVar6 = lVar6 + 1;
      pVVar2 = p->vObjs;
    } while (lVar6 < pVVar2->nSize);
  }
  iVar1 = 0xabcaa0;
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)uVar4,
         (ulong)(uint)(p->nObjs[5] + p->nObjs[1] + p->nObjs[6]),(ulong)uVar7,(ulong)uVar5);
  Abc_Print(iVar1,"%s =","Time");
  level = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar3) / 1000000.0);
  return;
}

Assistant:

void Ivy_ManTestCutsAll( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        nCutsCut    = Ivy_NodeFindCutsAll( p, pObj, 5 )->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}